

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::Deserializer::
ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  ulong uVar1;
  undefined2 in_CX;
  undefined6 in_register_0000000a;
  undefined2 in_DX;
  long *in_RSI;
  Expression *in_RDI;
  type *ret;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_00;
  undefined6 in_stack_ffffffffffffffe8;
  
  this_00._M_head_impl = in_RDI;
  uVar1 = (**(code **)(*in_RSI + 0x20))(in_RSI,in_DX,CONCAT62(in_register_0000000a,in_CX),in_DX);
  if ((uVar1 & 1) == 0) {
    (**(code **)(*in_RSI + 0x28))(in_RSI,0);
    SerializationDefaultValue::
    GetDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ();
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               this_00._M_head_impl,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_RDI);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0xaef967);
  }
  else {
    Read<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::Expression>
              ((Deserializer *)CONCAT26(in_DX,in_stack_ffffffffffffffe8));
    (**(code **)(*in_RSI + 0x28))(in_RSI,1);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         this_00._M_head_impl;
}

Assistant:

inline T ReadPropertyWithDefault(const field_id_t field_id, const char *tag) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(SerializationDefaultValue::GetDefault<T>());
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}